

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O3

QColor QStyleHelper::backgroundColor(QPalette *pal,QWidget *widget)

{
  long lVar1;
  QPalette *pQVar2;
  long *plVar3;
  ColorGroup CVar4;
  
  CVar4 = (ColorGroup)pal;
  lVar1 = QMetaObject::cast((QObject *)&QScrollBar::staticMetaObject);
  if ((lVar1 != 0) && (*(long *)(*(long *)&widget->field_0x8 + 0x10) != 0)) {
    lVar1 = QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject);
    if (lVar1 != 0) {
      pQVar2 = QWidget::palette(*(QWidget **)
                                 (*(long *)(*(long *)(*(long *)&widget->field_0x8 + 0x10) + 8) +
                                 0x10));
      CVar4 = (ColorGroup)pQVar2;
    }
  }
  plVar3 = (long *)QPalette::brush(CVar4,Dark);
  return *(QColor *)(*plVar3 + 8);
}

Assistant:

QColor backgroundColor(const QPalette &pal, const QWidget* widget)
{
#if QT_CONFIG(scrollarea)
    if (qobject_cast<const QScrollBar *>(widget) && widget->parent() &&
            qobject_cast<const QAbstractScrollArea *>(widget->parent()->parent()))
        return widget->parentWidget()->parentWidget()->palette().color(QPalette::Base);
#else
    Q_UNUSED(widget);
#endif
    return pal.color(QPalette::Base);
}